

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBox::changeEvent(QComboBox *this,QEvent *e)

{
  short sVar1;
  QComboBoxPrivate *this_00;
  bool bVar2;
  QComboBoxPrivateContainer *pQVar3;
  long lVar4;
  undefined8 uVar5;
  long in_FS_OFFSET;
  double dVar6;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QComboBoxPrivate **)&(this->super_QWidget).field_0x8;
  sVar1 = *(short *)(e + 8);
  if (sVar1 == 0x27) {
    QComboBoxPrivate::updateViewContainerPaletteAndOpacity(this_00);
  }
  else if (sVar1 == 0x61) {
    (this_00->sizeHint).wd = -1;
    (this_00->sizeHint).ht = -1;
    pQVar3 = QComboBoxPrivate::viewContainer(this_00);
    QWidget::setFont((QWidget *)pQVar3,&((this->super_QWidget).data)->fnt);
    pQVar3 = QComboBoxPrivate::viewContainer(this_00);
    (**(code **)(*(long *)&(pQVar3->view->super_QAbstractScrollArea).super_QFrame.super_QWidget +
                0x220))();
    if (this_00->lineEdit != (QLineEdit *)0x0) {
      QComboBoxPrivate::updateLineEditGeometry(this_00);
    }
  }
  else if (sVar1 == 0x62) {
    if ((((this->super_QWidget).data)->widget_attributes & 1) != 0) {
      (**(code **)(*(long *)&this->super_QWidget + 0x1b0))(this);
    }
  }
  else if (sVar1 == 100) {
    bVar2 = QPointer::operator_cast_to_bool((QPointer *)&this_00->container);
    if (bVar2) {
      QComboBoxPrivateContainer::updateStyleSettings
                ((QComboBoxPrivateContainer *)(this_00->container).wp.value);
    }
    QComboBoxPrivate::updateDelegate(this_00,false);
    (this_00->minimumSizeHint).wd.m_i = -1;
    (this_00->minimumSizeHint).ht.m_i = -1;
    (this_00->sizeHint).wd.m_i = -1;
    (this_00->sizeHint).ht.m_i = -1;
    QComboBoxPrivate::updateLayoutDirection(this_00);
    if (this_00->lineEdit != (QLineEdit *)0x0) {
      QComboBoxPrivate::updateLineEditGeometry(this_00);
    }
    QWidgetPrivate::setLayoutItemMargins
              (&this_00->super_QWidgetPrivate,SE_ComboBoxLayoutItem,(QStyleOption *)0x0);
    if (*(short *)(e + 8) == 0xb1) {
      bVar2 = QWidget::testAttribute_helper(&this->super_QWidget,WA_MacSmallSize);
      if (bVar2) {
        uVar5 = 0x15;
      }
      else {
        bVar2 = QWidget::testAttribute_helper(&this->super_QWidget,WA_MacMiniSize);
        uVar5 = 0x16;
        if (!bVar2) {
          uVar5 = 0;
        }
      }
      lVar4 = (**(code **)(*QGuiApplicationPrivate::platform_theme + 0x58))
                        (QGuiApplicationPrivate::platform_theme,uVar5);
      if (lVar4 != 0) {
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
        QFont::QFont((QFont *)&local_38,&((this->super_QWidget).data)->fnt);
        dVar6 = (double)QFont::pointSizeF();
        QFont::setPointSizeF(dVar6);
        QWidget::setFont(&this->super_QWidget,(QFont *)&local_38);
        QFont::~QFont((QFont *)&local_38);
      }
    }
  }
  QWidget::changeEvent(&this->super_QWidget,e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBox::changeEvent(QEvent *e)
{
    Q_D(QComboBox);
    switch (e->type()) {
    case QEvent::StyleChange:
        if (d->container)
            d->container->updateStyleSettings();
        d->updateDelegate();

#ifdef Q_OS_MAC
    case QEvent::MacSizeChange:
#endif
        d->sizeHint = QSize(); // invalidate size hint
        d->minimumSizeHint = QSize();
        d->updateLayoutDirection();
        if (d->lineEdit)
            d->updateLineEditGeometry();
        d->setLayoutItemMargins(QStyle::SE_ComboBoxLayoutItem);

        if (e->type() == QEvent::MacSizeChange) {
            QPlatformTheme::Font f = QPlatformTheme::SystemFont;
            if (testAttribute(Qt::WA_MacSmallSize))
                f = QPlatformTheme::SmallFont;
            else if (testAttribute(Qt::WA_MacMiniSize))
                f = QPlatformTheme::MiniFont;
            if (const QFont *platformFont = QApplicationPrivate::platformTheme()->font(f)) {
                QFont f = font();
                f.setPointSizeF(platformFont->pointSizeF());
                setFont(f);
            }
        }
        // ### need to update scrollers etc. as well here
        break;
    case QEvent::EnabledChange:
        if (!isEnabled())
            hidePopup();
        break;
    case QEvent::PaletteChange: {
        d->updateViewContainerPaletteAndOpacity();
        break;
    }
    case QEvent::FontChange: {
        d->sizeHint = QSize(); // invalidate size hint
        d->viewContainer()->setFont(font());
        d->viewContainer()->itemView()->doItemsLayout();
        if (d->lineEdit)
            d->updateLineEditGeometry();
        break;
    }
    default:
        break;
    }
    QWidget::changeEvent(e);
}